

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

Belief * __thiscall despot::BaseTag::Tau(BaseTag *this,Belief *belief,ACT_TYPE action,OBS_TYPE obs)

{
  double dVar1;
  double dVar2;
  value_type pSVar3;
  OBS_TYPE OVar4;
  int iVar5;
  int iVar6;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_00;
  size_type sVar7;
  const_reference ppSVar8;
  const_reference this_01;
  const_reference this_02;
  const_reference pvVar9;
  const_reference ppTVar10;
  reference pvVar11;
  ParticleBelief *pPVar12;
  double dVar13;
  pointer ppSVar14;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_b8;
  value_type local_a0;
  State *new_particle;
  undefined1 local_90 [4];
  int i_1;
  vector<despot::State_*,_std::allocator<despot::State_*>_> new_particles;
  double p;
  State *next;
  int j;
  vector<despot::State,_std::allocator<despot::State>_> *distribution;
  TagState *state;
  double dStack_48;
  int i;
  double sum;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  OBS_TYPE local_28;
  OBS_TYPE obs_local;
  Belief *pBStack_18;
  ACT_TYPE action_local;
  Belief *belief_local;
  BaseTag *this_local;
  
  local_28 = obs;
  obs_local._4_4_ = action;
  pBStack_18 = belief;
  belief_local = (Belief *)this;
  if (Tau(despot::Belief_const*,int,unsigned_long)::probs == '\0') {
    iVar5 = __cxa_guard_acquire(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
    if (iVar5 != 0) {
      iVar5 = (**(code **)(*(long *)this + 0x10))();
      std::allocator<double>::allocator((allocator<double> *)((long)&particles + 3));
      std::vector<double,_std::allocator<double>_>::vector
                (&Tau::probs,(long)iVar5,(allocator<double> *)((long)&particles + 3));
      std::allocator<double>::~allocator((allocator<double> *)((long)&particles + 3));
      __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&Tau::probs,&__dso_handle);
      __cxa_guard_release(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
    }
  }
  this_00 = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
            (**(code **)(*(long *)pBStack_18 + 0x30))();
  dStack_48 = 0.0;
  state._4_4_ = 0;
  while( true ) {
    sVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(this_00);
    if (sVar7 <= (ulong)(long)state._4_4_) break;
    ppSVar8 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (this_00,(long)state._4_4_);
    pSVar3 = *ppSVar8;
    iVar5 = (**(code **)(*(long *)this + 0x58))(this,pSVar3);
    this_01 = std::
              vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
              ::operator[](&this->transition_probabilities_,(long)iVar5);
    this_02 = std::
              vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
              ::operator[](this_01,(long)obs_local._4_4_);
    next._4_4_ = 0;
    while( true ) {
      sVar7 = std::vector<despot::State,_std::allocator<despot::State>_>::size(this_02);
      if (sVar7 <= (ulong)(long)next._4_4_) break;
      pvVar9 = std::vector<despot::State,_std::allocator<despot::State>_>::operator[]
                         (this_02,(long)next._4_4_);
      OVar4 = local_28;
      dVar1 = *(double *)(pSVar3 + 0x18);
      dVar2 = *(double *)(pvVar9 + 0x18);
      ppTVar10 = std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::operator[]
                           (&this->states_,(long)*(int *)(pvVar9 + 0xc));
      dVar13 = (double)(**(code **)(*(long *)this + 0x68))(this,OVar4,*ppTVar10,obs_local._4_4_);
      ppSVar14 = (pointer)(dVar1 * dVar2 * dVar13);
      new_particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ppSVar14;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&Tau::probs,(long)*(int *)(pvVar9 + 0xc));
      *pvVar11 = (double)ppSVar14 + *pvVar11;
      dStack_48 = (double)new_particles.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + dStack_48;
      next._4_4_ = next._4_4_ + 1;
    }
    state._4_4_ = state._4_4_ + 1;
  }
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_90);
  new_particle._4_4_ = 0;
  while( true ) {
    iVar5 = new_particle._4_4_;
    iVar6 = (**(code **)(*(long *)this + 0x10))();
    if (iVar6 <= iVar5) break;
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        (&Tau::probs,(long)new_particle._4_4_);
    if (0.0 < *pvVar11) {
      ppTVar10 = std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::operator[]
                           (&this->states_,(long)new_particle._4_4_);
      local_a0 = (value_type)(**(code **)(*(long *)this + 0xe8))(this,*ppTVar10);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&Tau::probs,(long)new_particle._4_4_);
      *(double *)(local_a0 + 0x18) = *pvVar11 / dStack_48;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_90,&local_a0);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&Tau::probs,(long)new_particle._4_4_);
      *pvVar11 = 0.0;
    }
    new_particle._4_4_ = new_particle._4_4_ + 1;
  }
  pPVar12 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            (&local_b8,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_90);
  despot::ParticleBelief::ParticleBelief(pPVar12,&local_b8,&this->super_BeliefMDP,0);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector(&local_b8);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::~vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)local_90);
  return (Belief *)pPVar12;
}

Assistant:

Belief* BaseTag::Tau(const Belief* belief, ACT_TYPE action, OBS_TYPE obs) const {
	static vector<double> probs = vector<double>(NumStates());

	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		TagState* state = static_cast<TagState*>(particles[i]);
		const vector<State>& distribution = transition_probabilities_[GetIndex(
			state)][action];
		for (int j = 0; j < distribution.size(); j++) {
			const State& next = distribution[j];
			double p = state->weight * next.weight
				* ObsProb(obs, *(states_[next.state_id]), action);
			probs[next.state_id] += p;
			sum += p;
		}
	}

	vector<State*> new_particles;
	for (int i = 0; i < NumStates(); i++) {
		if (probs[i] > 0) {
			State* new_particle = Copy(states_[i]);
			new_particle->weight = probs[i] / sum;
			new_particles.push_back(new_particle);
			probs[i] = 0;
		}
	}

	return new ParticleBelief(new_particles, this, NULL, false);
}